

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O1

void __thiscall ExampleAppDocuments::ExampleAppDocuments(ExampleAppDocuments *this)

{
  ImVec4 *pIVar1;
  int iVar2;
  MyDocument *pMVar3;
  MyDocument *pMVar4;
  int iVar5;
  int iVar6;
  
  (this->Documents).Size = 0;
  (this->Documents).Capacity = 0;
  (this->Documents).Data = (MyDocument *)0x0;
  if ((this->Documents).Capacity == 0) {
    pMVar4 = (MyDocument *)ImGui::MemAlloc(0x100);
    pMVar3 = (this->Documents).Data;
    if (pMVar3 != (MyDocument *)0x0) {
      memcpy(pMVar4,pMVar3,(long)(this->Documents).Size << 5);
      ImGui::MemFree((this->Documents).Data);
    }
    (this->Documents).Data = pMVar4;
    (this->Documents).Capacity = 8;
  }
  pMVar3 = (this->Documents).Data;
  iVar5 = (this->Documents).Size;
  pMVar3[iVar5].Name = "Lettuce";
  pMVar4 = pMVar3 + iVar5;
  pMVar4->Open = true;
  pMVar4->OpenPrev = true;
  pMVar4->Dirty = false;
  pMVar4->WantClose = false;
  pIVar1 = &pMVar3[iVar5].Color;
  pIVar1->x = 0.4;
  pIVar1->y = 0.8;
  pIVar1->z = 0.4;
  pIVar1->w = 1.0;
  iVar6 = (this->Documents).Size;
  iVar2 = (this->Documents).Capacity;
  iVar5 = iVar6 + 1;
  (this->Documents).Size = iVar5;
  if (iVar5 == iVar2) {
    iVar6 = iVar6 + 2;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      pMVar4 = (MyDocument *)ImGui::MemAlloc((long)iVar6 << 5);
      pMVar3 = (this->Documents).Data;
      if (pMVar3 != (MyDocument *)0x0) {
        memcpy(pMVar4,pMVar3,(long)(this->Documents).Size << 5);
        ImGui::MemFree((this->Documents).Data);
      }
      (this->Documents).Data = pMVar4;
      (this->Documents).Capacity = iVar6;
    }
  }
  pMVar3 = (this->Documents).Data;
  iVar5 = (this->Documents).Size;
  pMVar3[iVar5].Name = "Eggplant";
  pMVar4 = pMVar3 + iVar5;
  pMVar4->Open = true;
  pMVar4->OpenPrev = true;
  pMVar4->Dirty = false;
  pMVar4->WantClose = false;
  pIVar1 = &pMVar3[iVar5].Color;
  pIVar1->x = 0.8;
  pIVar1->y = 0.5;
  pIVar1->z = 1.0;
  pIVar1->w = 1.0;
  iVar6 = (this->Documents).Size;
  iVar2 = (this->Documents).Capacity;
  iVar5 = iVar6 + 1;
  (this->Documents).Size = iVar5;
  if (iVar5 == iVar2) {
    iVar6 = iVar6 + 2;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      pMVar4 = (MyDocument *)ImGui::MemAlloc((long)iVar6 << 5);
      pMVar3 = (this->Documents).Data;
      if (pMVar3 != (MyDocument *)0x0) {
        memcpy(pMVar4,pMVar3,(long)(this->Documents).Size << 5);
        ImGui::MemFree((this->Documents).Data);
      }
      (this->Documents).Data = pMVar4;
      (this->Documents).Capacity = iVar6;
    }
  }
  pMVar3 = (this->Documents).Data;
  iVar5 = (this->Documents).Size;
  pMVar3[iVar5].Name = "Carrot";
  pMVar4 = pMVar3 + iVar5;
  pMVar4->Open = true;
  pMVar4->OpenPrev = true;
  pMVar4->Dirty = false;
  pMVar4->WantClose = false;
  pIVar1 = &pMVar3[iVar5].Color;
  pIVar1->x = 1.0;
  pIVar1->y = 0.8;
  pIVar1->z = 0.5;
  pIVar1->w = 1.0;
  iVar6 = (this->Documents).Size;
  iVar2 = (this->Documents).Capacity;
  iVar5 = iVar6 + 1;
  (this->Documents).Size = iVar5;
  if (iVar5 == iVar2) {
    iVar6 = iVar6 + 2;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      pMVar4 = (MyDocument *)ImGui::MemAlloc((long)iVar6 << 5);
      pMVar3 = (this->Documents).Data;
      if (pMVar3 != (MyDocument *)0x0) {
        memcpy(pMVar4,pMVar3,(long)(this->Documents).Size << 5);
        ImGui::MemFree((this->Documents).Data);
      }
      (this->Documents).Data = pMVar4;
      (this->Documents).Capacity = iVar6;
    }
  }
  pMVar3 = (this->Documents).Data;
  iVar5 = (this->Documents).Size;
  pMVar3[iVar5].Name = "Tomato";
  pMVar4 = pMVar3 + iVar5;
  pMVar4->Open = false;
  pMVar4->OpenPrev = false;
  pMVar4->Dirty = false;
  pMVar4->WantClose = false;
  pIVar1 = &pMVar3[iVar5].Color;
  pIVar1->x = 1.0;
  pIVar1->y = 0.3;
  pIVar1->z = 0.4;
  pIVar1->w = 1.0;
  iVar6 = (this->Documents).Size;
  iVar2 = (this->Documents).Capacity;
  iVar5 = iVar6 + 1;
  (this->Documents).Size = iVar5;
  if (iVar5 == iVar2) {
    iVar6 = iVar6 + 2;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      pMVar4 = (MyDocument *)ImGui::MemAlloc((long)iVar6 << 5);
      pMVar3 = (this->Documents).Data;
      if (pMVar3 != (MyDocument *)0x0) {
        memcpy(pMVar4,pMVar3,(long)(this->Documents).Size << 5);
        ImGui::MemFree((this->Documents).Data);
      }
      (this->Documents).Data = pMVar4;
      (this->Documents).Capacity = iVar6;
    }
  }
  pMVar3 = (this->Documents).Data;
  iVar5 = (this->Documents).Size;
  pMVar3[iVar5].Name = "A Rather Long Title";
  pMVar4 = pMVar3 + iVar5;
  pMVar4->Open = false;
  pMVar4->OpenPrev = false;
  pMVar4->Dirty = false;
  pMVar4->WantClose = false;
  pIVar1 = &pMVar3[iVar5].Color;
  pIVar1->x = 1.0;
  pIVar1->y = 1.0;
  pIVar1->z = 1.0;
  pIVar1->w = 1.0;
  iVar6 = (this->Documents).Size;
  iVar2 = (this->Documents).Capacity;
  iVar5 = iVar6 + 1;
  (this->Documents).Size = iVar5;
  if (iVar5 == iVar2) {
    iVar6 = iVar6 + 2;
    if (iVar2 == 0) {
      iVar5 = 8;
    }
    else {
      iVar5 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar5) {
      iVar6 = iVar5;
    }
    if (iVar2 < iVar6) {
      pMVar4 = (MyDocument *)ImGui::MemAlloc((long)iVar6 << 5);
      pMVar3 = (this->Documents).Data;
      if (pMVar3 != (MyDocument *)0x0) {
        memcpy(pMVar4,pMVar3,(long)(this->Documents).Size << 5);
        ImGui::MemFree((this->Documents).Data);
      }
      (this->Documents).Data = pMVar4;
      (this->Documents).Capacity = iVar6;
    }
  }
  pMVar3 = (this->Documents).Data;
  iVar5 = (this->Documents).Size;
  pMVar3[iVar5].Name = "Some Document";
  pMVar4 = pMVar3 + iVar5;
  pMVar4->Open = false;
  pMVar4->OpenPrev = false;
  pMVar4->Dirty = false;
  pMVar4->WantClose = false;
  pIVar1 = &pMVar3[iVar5].Color;
  pIVar1->x = 1.0;
  pIVar1->y = 1.0;
  pIVar1->z = 1.0;
  pIVar1->w = 1.0;
  (this->Documents).Size = (this->Documents).Size + 1;
  return;
}

Assistant:

ExampleAppDocuments()
    {
        Documents.push_back(MyDocument("Lettuce",             true,  ImVec4(0.4f, 0.8f, 0.4f, 1.0f)));
        Documents.push_back(MyDocument("Eggplant",            true,  ImVec4(0.8f, 0.5f, 1.0f, 1.0f)));
        Documents.push_back(MyDocument("Carrot",              true,  ImVec4(1.0f, 0.8f, 0.5f, 1.0f)));
        Documents.push_back(MyDocument("Tomato",              false, ImVec4(1.0f, 0.3f, 0.4f, 1.0f)));
        Documents.push_back(MyDocument("A Rather Long Title", false));
        Documents.push_back(MyDocument("Some Document",       false));
    }